

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

char * hts_parse_reg(char *s,int *beg,int *end)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ushort **ppuVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  long lVar13;
  undefined8 uStack_80;
  char acStack_78 [8];
  int *local_70;
  int *local_68;
  char *local_60;
  long local_58;
  char *local_50;
  char *local_48;
  char *tmp;
  size_t local_38;
  size_t sVar12;
  
  *end = -1;
  *beg = -1;
  uStack_80 = 0x11121b;
  local_38 = strlen(s);
  uVar4 = (uint)local_38;
  lVar13 = 0;
  sVar12 = local_38;
  do {
    iVar3 = (int)sVar12;
    if (iVar3 < 1) goto LAB_001113d4;
    iVar8 = (int)lVar13;
    lVar13 = lVar13 + -1;
    uVar11 = iVar3 - 1;
    sVar12 = (size_t)uVar11;
  } while (s[(uVar4 - 1) + iVar8] != ':');
  uVar6 = uVar4;
  if (iVar3 < (int)uVar4 && (int)uVar11 < (int)uVar4) {
    pcVar9 = s + (long)(int)(uVar4 - 1) + 2;
    lVar7 = (long)(int)(uVar4 - 1) + 3;
    iVar3 = 0;
    bVar2 = true;
    local_70 = end;
    local_68 = beg;
    local_60 = s;
    local_58 = lVar7;
    local_50 = pcVar9;
    do {
      cVar1 = pcVar9[lVar13];
      if ((long)cVar1 == 0x2d) {
        iVar3 = iVar3 + 1;
      }
      else {
        uStack_80 = 0x1112ab;
        tmp._4_4_ = iVar3;
        ppuVar5 = __ctype_b_loc();
        lVar7 = local_58;
        s = local_60;
        pcVar9 = local_50;
        iVar3 = tmp._4_4_;
        if ((cVar1 != ',') && (((*ppuVar5)[cVar1] & 0x800) == 0)) break;
      }
      bVar2 = lVar7 + lVar13 < (long)(int)uVar4;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != -1);
    uVar6 = (uint)local_38;
    if (1 < iVar3) {
      uVar11 = uVar6;
    }
    beg = local_68;
    end = local_70;
    if (bVar2) {
      uVar11 = uVar6;
    }
  }
  iVar3 = uVar6 - uVar11;
  uVar4 = uVar11;
  if (iVar3 != 0 && (int)uVar11 <= (int)uVar6) {
    lVar13 = -((long)(iVar3 + 1) + 0xfU & 0xfffffffffffffff0);
    pcVar9 = acStack_78 + lVar13;
    local_48 = pcVar9;
    if ((int)(uVar11 + 1) < (int)uVar6) {
      lVar7 = 1;
      iVar8 = 0;
      do {
        if (s[lVar7 + (int)uVar11] != ',') {
          lVar10 = (long)iVar8;
          iVar8 = iVar8 + 1;
          pcVar9[lVar10] = s[lVar7 + (int)uVar11];
        }
        lVar7 = lVar7 + 1;
      } while (iVar3 != (int)lVar7);
      lVar7 = (long)iVar8;
    }
    else {
      lVar7 = 0;
    }
    pcVar9[lVar7] = '\0';
    *(undefined8 *)((long)&uStack_80 + lVar13) = 0x11138d;
    lVar7 = strtol(pcVar9,&local_48,10);
    iVar8 = (int)lVar7 + -1;
    iVar3 = 0;
    if (0 < iVar8) {
      iVar3 = iVar8;
    }
    *beg = iVar3;
    if (*local_48 == '\0') {
      iVar3 = 0x7fffffff;
    }
    else {
      pcVar9 = local_48 + 1;
      *(undefined8 *)((long)&uStack_80 + lVar13) = 0x1113b6;
      lVar13 = strtol(pcVar9,&local_48,10);
      iVar3 = (int)lVar13;
    }
    uVar6 = (uint)local_38;
    *end = iVar3;
    if (iVar3 < *beg) {
      uVar4 = uVar6;
    }
  }
  if (uVar4 == uVar6) {
LAB_001113d4:
    *beg = 0;
    *end = 0x7fffffff;
  }
  return s + (int)uVar4;
}

Assistant:

const char *hts_parse_reg(const char *s, int *beg, int *end)
{
    int i, k, l, name_end;
    *beg = *end = -1;
    name_end = l = strlen(s);
    // determine the sequence name
    for (i = l - 1; i >= 0; --i) if (s[i] == ':') break; // look for colon from the end
    if (i >= 0) name_end = i;
    if (name_end < l) { // check if this is really the end
        int n_hyphen = 0;
        for (i = name_end + 1; i < l; ++i) {
            if (s[i] == '-') ++n_hyphen;
            else if (!isdigit(s[i]) && s[i] != ',') break;
        }
        if (i < l || n_hyphen > 1) name_end = l; // malformated region string; then take str as the name
    }
    // parse the interval
    if (name_end < l) {
        char *tmp;
        tmp = (char*)alloca(l - name_end + 1);
        for (i = name_end + 1, k = 0; i < l; ++i)
            if (s[i] != ',') tmp[k++] = s[i];
        tmp[k] = 0;
        if ((*beg = strtol(tmp, &tmp, 10) - 1) < 0) *beg = 0;
        *end = *tmp? strtol(tmp + 1, &tmp, 10) : INT_MAX;
        if (*beg > *end) name_end = l;
    }
    if (name_end == l) *beg = 0, *end = INT_MAX;
    return s + name_end;
}